

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fw_data_parser.c
# Opt level: O2

int image_fwdata_get_version2(igsc_fwdata_image *img,igsc_fwdata_version2 *version)

{
  int iVar1;
  long lVar2;
  int *piVar3;
  int iVar4;
  igsc_log_func_t p_Var5;
  char *pcVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  long in_FS_OFFSET;
  char __time_buf [128];
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  piVar3 = (int *)(img->layout).table[0].content;
  iVar4 = 0;
  if (*piVar3 == 0x401) {
    uVar7 = 1;
    uVar8 = 0;
  }
  else {
    if (*piVar3 != 0x402) {
      p_Var5 = igsc_get_log_callback_func();
      if (p_Var5 == (igsc_log_func_t)0x0) {
        pcVar6 = gsc_time(__time_buf,0x80);
        syslog(3,"%s: IGSC: (%s:%s():%d) Bad version format %u\n",pcVar6,
               "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/fw_data_parser.c"
               ,"image_fwdata_get_version2",0x4c,*piVar3);
      }
      else {
        p_Var5 = igsc_get_log_callback_func();
        pcVar6 = gsc_time(__time_buf,0x80);
        (*p_Var5)(IGSC_LOG_LEVEL_ERROR,"%s: IGSC: (%s:%s():%d) Bad version format %u\n",pcVar6,
                  "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/fw_data_parser.c"
                  ,"image_fwdata_get_version2",0x4c,*piVar3);
      }
      iVar4 = 5;
      goto LAB_0011b141;
    }
    uVar8 = piVar3[4];
    uVar7 = 2;
  }
  version->data_arb_svn = uVar8;
  version->format_version = uVar7;
  version->flags = 0;
  version->data_arb_svn_fitb = 0;
  version->oem_manuf_data_version = piVar3[1];
  version->oem_manuf_data_version_fitb = 0;
  iVar1 = piVar3[2];
  version->major_version = (short)iVar1;
  version->major_vcn = (short)((uint)iVar1 >> 0x10);
LAB_0011b141:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return iVar4;
  }
  __stack_chk_fail();
}

Assistant:

int image_fwdata_get_version2(struct igsc_fwdata_image* img,
                              struct igsc_fwdata_version2* version)
{
    struct gsc_fwu_heci_image_metadata* metadata = (struct gsc_fwu_heci_image_metadata*)img->layout.table[FWU_FPT_ENTRY_IMAGE_INFO].content;
    struct igsc_fwdata_metadata* meta = (struct igsc_fwdata_metadata*)&metadata->metadata;

    switch (metadata->metadata_format_version)
    {
    case FWU_GSC_HECI_METADATA_DATA_UPDATE_VERSION_1:
        version->data_arb_svn = 0;
        version->format_version = IGSC_FWDATA_FORMAT_VERSION_1;
        break;
    case FWU_GSC_HECI_METADATA_DATA_UPDATE_VERSION_2:
        version->data_arb_svn = meta->data_arb_svn;
        version->format_version = IGSC_FWDATA_FORMAT_VERSION_2;
        break;
    default:
        gsc_error("Bad version format %u\n", metadata->metadata_format_version);
        return IGSC_ERROR_BAD_IMAGE;
    }
    version->flags = 0;
    version->data_arb_svn_fitb = 0;
    version->oem_manuf_data_version = meta->oem_manuf_data_version;
    version->oem_manuf_data_version_fitb = 0;
    version->major_vcn = meta->major_vcn;
    version->major_version = meta->major_fw_version;

    return IGSC_SUCCESS;
}